

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# S2Test.cpp
# Opt level: O0

void __thiscall S2NoAllocation::test_method(S2NoAllocation *this)

{
  Index IVar1;
  Index IVar2;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_7d8;
  Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>> local_7b0 [40];
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_788;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_760;
  Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> local_738;
  Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>> local_6f8 [40];
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_6d0;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_6a8;
  Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> local_680;
  Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>> local_640 [40];
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_618;
  Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> local_5f0;
  Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>> local_5b0 [40];
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_588;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_560;
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> local_538 [24];
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_520;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_4f8;
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> local_4d0 [24];
  RandomReturnType local_4b8;
  undefined1 local_4a0 [8];
  MatrixXd H2;
  undefined1 local_470 [8];
  MatrixXd H1;
  undefined1 local_440 [8];
  MatrixXd H0;
  undefined1 local_420 [8];
  MatrixXd J2;
  undefined1 local_400 [8];
  MatrixXd J1;
  undefined1 local_3d0 [8];
  MatrixXd J0;
  undefined1 local_3b0 [8];
  VectorXd z;
  Ref_conflict local_378 [24];
  undefined1 local_360 [8];
  VectorXd vx;
  EigenBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
  local_228 [24];
  undefined1 local_210 [8];
  VectorXd y;
  Point local_1f0 [296];
  EigenBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
  local_c8 [24];
  undefined1 local_b0 [8];
  VectorXd x;
  Index c;
  S2 Space;
  S2NoAllocation *this_local;
  
  mnf::S2::S2((S2 *)&c);
  x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 3;
  mnf::Manifold::createRandomPoint(1.0);
  mnf::SubPoint::value();
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
            ((Matrix<double,_1,1,0,_1,1> *)local_b0,local_c8);
  mnf::Point::~Point(local_1f0);
  mnf::Manifold::createRandomPoint(1.0);
  mnf::SubPoint::value();
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
            ((Matrix<double,_1,1,0,_1,1> *)local_210,local_228);
  mnf::Point::~Point((Point *)&vx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                               m_storage.m_rows);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)
             &z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_b0,(type *)0x0);
  mnf::S2::randVec(local_378);
  Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,3,1,0,3,1>>
            ((Matrix<double,_1,1,0,_1,1> *)local_360,
             (EigenBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_378);
  Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
            ((Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)
             &z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  J0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       mnf::Manifold::representationDim();
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_3b0,
             &J0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  IVar2 = x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  IVar1 = mnf::Manifold::representationDim();
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Random
            ((RandomReturnType *)
             &J1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
             IVar2,IVar1);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_3d0,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&J1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                 m_cols);
  J2.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       mnf::Manifold::representationDim();
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<long,long>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_400,
             &x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
             &J2.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  H0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       mnf::Manifold::representationDim();
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<long,long>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_420,
             &x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
             &H0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  IVar2 = mnf::Manifold::tangentDim();
  IVar1 = mnf::Manifold::tangentDim();
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Random
            ((RandomReturnType *)
             &H1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
             IVar2,IVar1);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_440,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&H1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                 m_cols);
  IVar2 = mnf::Manifold::tangentDim();
  IVar1 = mnf::Manifold::tangentDim();
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Random
            ((RandomReturnType *)
             &H2.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
             IVar2,IVar1);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_470,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&H2.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                 m_cols);
  IVar2 = mnf::Manifold::tangentDim();
  IVar1 = mnf::Manifold::tangentDim();
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Random(&local_4b8,IVar2,IVar1);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_4a0,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_4b8);
  Eigen::internal::set_is_malloc_allowed(false);
  mnf::utils::set_is_malloc_allowed(false);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            (local_4d0,(PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_3b0,
             (type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_4f8,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_b0,(type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_520,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_360,(type *)0x0);
  mnf::Manifold::retractation(&c,local_4d0,&local_4f8,&local_520);
  Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
            (&local_520);
  Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
            (&local_4f8);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            (local_538,(PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_3b0,
             (type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_560,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_b0,(type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_588,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_210,(type *)0x0);
  mnf::Manifold::pseudoLog(&c,local_538,&local_560,&local_588);
  Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
            (&local_588);
  Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
            (&local_560);
  Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>::
  Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            (local_5b0,(PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_400,
             (type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>::
  Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>> *)&local_5f0,
             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_3d0,(type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_618,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_b0,(type *)0x0);
  mnf::Manifold::applyDiffRetractation(&c,local_5b0,&local_5f0,&local_618);
  Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
            (&local_618);
  Eigen::Ref<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>::~Ref
            (&local_5f0);
  Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>::
  Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            (local_640,(PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_470,
             (type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>::
  Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>> *)&local_680,
             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_440,(type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_6a8,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_b0,(type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_6d0,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_360,(type *)0x0);
  mnf::Manifold::applyTransport(&c,local_640,&local_680,&local_6a8,&local_6d0);
  Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
            (&local_6d0);
  Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
            (&local_6a8);
  Eigen::Ref<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>::~Ref
            (&local_680);
  Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>::
  Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            (local_6f8,(PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_4a0,
             (type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>::
  Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>> *)&local_738,
             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_440,(type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_760,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_b0,(type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_788,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_360,(type *)0x0);
  mnf::Manifold::applyInvTransport(&c,local_6f8,&local_738,&local_760,&local_788);
  Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
            (&local_788);
  Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
            (&local_760);
  Eigen::Ref<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>::~Ref
            (&local_738);
  Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>::
  Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            (local_7b0,(PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_440,
             (type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_7d8,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_b0,(type *)0x0);
  mnf::Manifold::getIdentityOnTxM(&c,local_7b0,&local_7d8);
  Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
            (&local_7d8);
  mnf::utils::set_is_malloc_allowed(true);
  Eigen::internal::set_is_malloc_allowed(true);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_4a0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_470);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_440);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_420);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_400);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_3d0);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_3b0);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_360);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_210);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_b0);
  mnf::S2::~S2((S2 *)&c);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(S2NoAllocation)
{
  // We only test here that the operations on the manifold do not create
  // temporary. Passing arguments that are not recognize by the Eigen::Ref will
  // create temporaries, but this is the user's fault.
  S2 Space;
  Index c = 3;
  // VectorXd x = VectorXd::Random(Space.representationDim());
  // VectorXd y = VectorXd::Random(Space.representationDim());
  VectorXd x = Space.createRandomPoint().value();
  VectorXd y = Space.createRandomPoint().value();
  VectorXd vx = Space.randVec(x);
  VectorXd z(Space.representationDim());
  MatrixXd J0 = MatrixXd::Random(c, Space.representationDim());
  MatrixXd J1(c, Space.representationDim());
  MatrixXd J2(c, Space.representationDim());
  MatrixXd H0 = MatrixXd::Random(Space.tangentDim(), Space.tangentDim());
  MatrixXd H1 = MatrixXd::Random(Space.tangentDim(), Space.tangentDim());
  MatrixXd H2 = MatrixXd::Random(Space.tangentDim(), Space.tangentDim());

  internal::set_is_malloc_allowed(false);
  utils::set_is_malloc_allowed(false);
  {
    Space.retractation(z, x, vx);
    Space.pseudoLog(z, x, y);
    Space.applyDiffRetractation(J1, J0, x);
    Space.applyTransport(H1, H0, x, vx);
    Space.applyInvTransport(H2, H0, x, vx);
    Space.getIdentityOnTxM(H0, x);
  }
  utils::set_is_malloc_allowed(true);
  internal::set_is_malloc_allowed(true);
}